

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubD::SharpEdgeCount(ON_SubD *this,ON_SubDEdgeSharpness *sharpness_range)

{
  uint uVar1;
  bool bVar2;
  ON_SubDEdgeSharpness local_7c;
  float local_74 [2];
  ON_SubDEdge *local_60;
  ON_SubDEdge *e;
  ON_SubDEdgeIterator eit;
  uint sharp_edge_count;
  ON_SubDEdgeSharpness *sharpness_range_local;
  ON_SubD *this_local;
  
  *(ON_SubDEdgeSharpness *)sharpness_range->m_edge_sharpness = (ON_SubDEdgeSharpness)0x0;
  eit.m_component_ptr.m_ptr._4_4_ = 0;
  EdgeIterator((ON_SubDEdgeIterator *)&e,this);
  local_60 = ON_SubDEdgeIterator::FirstEdge((ON_SubDEdgeIterator *)&e);
  while (uVar1 = eit.m_component_ptr.m_ptr._4_4_, local_60 != (ON_SubDEdge *)0x0) {
    bVar2 = ON_SubDEdge::IsSharp(local_60);
    if (bVar2) {
      local_7c = ON_SubDEdge::Sharpness(local_60,false);
      local_74 = (float  [2])ON_SubDEdgeSharpness::Union(sharpness_range,&local_7c);
      *&sharpness_range->m_edge_sharpness = local_74;
      eit.m_component_ptr.m_ptr._4_4_ = eit.m_component_ptr.m_ptr._4_4_ + 1;
    }
    local_60 = ON_SubDEdgeIterator::NextEdge((ON_SubDEdgeIterator *)&e);
  }
  ON_SubDEdgeIterator::~ON_SubDEdgeIterator((ON_SubDEdgeIterator *)&e);
  return uVar1;
}

Assistant:

unsigned int ON_SubD::SharpEdgeCount(ON_SubDEdgeSharpness& sharpness_range) const
{
  sharpness_range = ON_SubDEdgeSharpness::Smooth;
  unsigned int sharp_edge_count = 0;
  ON_SubDEdgeIterator eit = this->EdgeIterator();
  for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
  {
    if (e->IsSharp())
    {
      sharpness_range = ON_SubDEdgeSharpness::Union(sharpness_range, e->Sharpness(false));
      ++sharp_edge_count;      
    }
  }
  return sharp_edge_count;
}